

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddLine(ImDrawList *this,ImVec2 *p1,ImVec2 *p2,ImU32 col,float thickness)

{
  uint in_ECX;
  ImDrawList *in_RSI;
  ImVec2 *in_stack_ffffffffffffff88;
  ImVec2 *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  float _x;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  
  if ((in_ECX & 0xff000000) != 0) {
    this_00 = &local_30;
    _x = 0.5;
    ImVec2::ImVec2(this_00,0.5,0.5);
    local_28 = operator+(in_stack_ffffffffffffff88,(ImVec2 *)0x1591f3);
    PathLineTo(in_RSI,in_stack_ffffffffffffff88);
    ImVec2::ImVec2(&local_40,_x,_x);
    local_38 = operator+(in_stack_ffffffffffffff88,(ImVec2 *)0x159239);
    PathLineTo(in_RSI,in_stack_ffffffffffffff88);
    PathStroke((ImDrawList *)CONCAT44(_x,in_stack_ffffffffffffffa0),(ImU32)((ulong)this_00 >> 0x20),
               SUB81((ulong)this_00 >> 0x18,0),(float)((ulong)in_RSI >> 0x20));
  }
  return;
}

Assistant:

void ImDrawList::AddLine(const ImVec2& p1, const ImVec2& p2, ImU32 col, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    PathLineTo(p1 + ImVec2(0.5f, 0.5f));
    PathLineTo(p2 + ImVec2(0.5f, 0.5f));
    PathStroke(col, false, thickness);
}